

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O0

pair<unsigned_int,_const_dg::vr::AllocatedArea_*> __thiscall
dg::vr::StructureAnalyzer::getAllocatedAreaFor(StructureAnalyzer *this,Value *ptr)

{
  bool bVar1;
  Value *pVVar2;
  Value *in_RSI;
  long in_RDI;
  pair<unsigned_int,_const_dg::vr::AllocatedArea_*> pVar3;
  AllocatedArea *area;
  const_iterator __end2;
  const_iterator __begin2;
  vector<dg::vr::AllocatedArea,_std::allocator<dg::vr::AllocatedArea>_> *__range2;
  uint i;
  vector<dg::vr::AllocatedArea,_std::allocator<dg::vr::AllocatedArea>_> *in_stack_ffffffffffffff98;
  __normal_iterator<const_dg::vr::AllocatedArea_*,_std::vector<dg::vr::AllocatedArea,_std::allocator<dg::vr::AllocatedArea>_>_>
  *in_stack_ffffffffffffffa0;
  int local_54;
  reference local_50;
  reference local_48;
  AllocatedArea *local_40;
  __normal_iterator<const_dg::vr::AllocatedArea_*,_std::vector<dg::vr::AllocatedArea,_std::allocator<dg::vr::AllocatedArea>_>_>
  local_38;
  long local_30;
  uint local_24;
  Value *local_20;
  pair<unsigned_int,_const_dg::vr::AllocatedArea_*> local_10;
  
  local_24 = 0;
  local_30 = in_RDI + 0xb8;
  local_20 = in_RSI;
  local_38._M_current =
       (AllocatedArea *)
       std::vector<dg::vr::AllocatedArea,_std::allocator<dg::vr::AllocatedArea>_>::begin
                 (in_stack_ffffffffffffff98);
  local_40 = (AllocatedArea *)
             std::vector<dg::vr::AllocatedArea,_std::allocator<dg::vr::AllocatedArea>_>::end
                       (in_stack_ffffffffffffff98);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffa0,
                       (__normal_iterator<const_dg::vr::AllocatedArea_*,_std::vector<dg::vr::AllocatedArea,_std::allocator<dg::vr::AllocatedArea>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) {
      local_54 = 0;
      std::pair<unsigned_int,_const_dg::vr::AllocatedArea_*>::pair<int,_std::nullptr_t,_true>
                (&local_10,&local_54,(void **)&stack0xffffffffffffffa0);
LAB_001ef8b5:
      pVar3._4_4_ = 0;
      pVar3.first = local_10.first;
      pVar3.second = local_10.second;
      return pVar3;
    }
    local_48 = __gnu_cxx::
               __normal_iterator<const_dg::vr::AllocatedArea_*,_std::vector<dg::vr::AllocatedArea,_std::allocator<dg::vr::AllocatedArea>_>_>
               ::operator*(&local_38);
    pVVar2 = AllocatedArea::getPtr(local_48);
    if (pVVar2 == local_20) {
      local_50 = local_48;
      std::pair<unsigned_int,_const_dg::vr::AllocatedArea_*>::
      pair<unsigned_int_&,_const_dg::vr::AllocatedArea_*,_true>(&local_10,&local_24,&local_50);
      goto LAB_001ef8b5;
    }
    local_24 = local_24 + 1;
    __gnu_cxx::
    __normal_iterator<const_dg::vr::AllocatedArea_*,_std::vector<dg::vr::AllocatedArea,_std::allocator<dg::vr::AllocatedArea>_>_>
    ::operator++(&local_38);
  } while( true );
}

Assistant:

std::pair<unsigned, const AllocatedArea *>
StructureAnalyzer::getAllocatedAreaFor(const llvm::Value *ptr) const {
    unsigned i = 0;
    for (const auto &area : allocatedAreas) {
        if (area.getPtr() == ptr)
            return {i, &area};
        ++i;
    }
    return {0, nullptr};
}